

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

CURLcode Curl_close(Curl_easy **datap)

{
  uint *puVar1;
  undefined1 *puVar2;
  Curl_easy *data;
  
  if ((datap != (Curl_easy **)0x0) && (data = *datap, data != (Curl_easy *)0x0)) {
    *datap = (Curl_easy *)0x0;
    Curl_detach_connection(data);
    if (((data->state).field_0x776 & 4) == 0) {
      if (data->multi != (Curl_multi *)0x0) {
        curl_multi_remove_handle(data->multi,data);
      }
      if (data->multi_easy != (Curl_multi *)0x0) {
        curl_multi_cleanup(data->multi_easy);
        data->multi_easy = (Curl_multi *)0x0;
      }
    }
    Curl_expire_clear(data);
    data->magic = 0;
    if (((data->state).field_0x775 & 2) != 0) {
      (*Curl_cfree)((data->state).range);
    }
    Curl_req_free(&data->req,data);
    Curl_ssl_close_all(data);
    (*Curl_cfree)((data->state).first_host);
    (data->state).first_host = (char *)0x0;
    Curl_ssl_free_certinfo(data);
    if (((data->state).field_0x775 & 0x80) != 0) {
      (*Curl_cfree)((data->state).referer);
      puVar2 = &(data->state).field_0x775;
      *puVar2 = *puVar2 & 0x7f;
    }
    (data->state).referer = (char *)0x0;
    up_free(data);
    Curl_dyn_free(&(data->state).headerb);
    Curl_flush_cookies(data,true);
    Curl_altsvc_save(data,data->asi,(data->set).str[0x40]);
    Curl_altsvc_cleanup(&data->asi);
    Curl_hsts_save(data,data->hsts,(data->set).str[0x41]);
    if ((data->share == (Curl_share *)0x0) || (data->share->hsts == (hsts *)0x0)) {
      Curl_hsts_cleanup(&data->hsts);
    }
    curl_slist_free_all((data->state).hstslist);
    Curl_http_auth_cleanup_digest(data);
    (*Curl_cfree)((data->info).contenttype);
    (data->info).contenttype = (char *)0x0;
    (*Curl_cfree)((data->info).wouldredirect);
    (data->info).wouldredirect = (char *)0x0;
    Curl_resolver_cancel(data);
    Curl_resolver_cleanup((data->state).async.resolver);
    if (data->share != (Curl_share *)0x0) {
      Curl_share_lock(data,CURL_LOCK_DATA_SHARE,CURL_LOCK_ACCESS_SINGLE);
      puVar1 = &data->share->dirty;
      *puVar1 = *puVar1 - 1;
      Curl_share_unlock(data,CURL_LOCK_DATA_SHARE);
    }
    (*Curl_cfree)((data->state).aptr.proxyuserpwd);
    (data->state).aptr.proxyuserpwd = (char *)0x0;
    (*Curl_cfree)((data->state).aptr.uagent);
    (data->state).aptr.uagent = (char *)0x0;
    (*Curl_cfree)((data->state).aptr.userpwd);
    (data->state).aptr.userpwd = (char *)0x0;
    (*Curl_cfree)((data->state).aptr.accept_encoding);
    (data->state).aptr.accept_encoding = (char *)0x0;
    (*Curl_cfree)((data->state).aptr.te);
    (data->state).aptr.te = (char *)0x0;
    (*Curl_cfree)((data->state).aptr.rangeline);
    (data->state).aptr.rangeline = (char *)0x0;
    (*Curl_cfree)((data->state).aptr.ref);
    (data->state).aptr.ref = (char *)0x0;
    (*Curl_cfree)((data->state).aptr.host);
    (data->state).aptr.host = (char *)0x0;
    (*Curl_cfree)((data->state).aptr.cookiehost);
    (data->state).aptr.cookiehost = (char *)0x0;
    (*Curl_cfree)((data->state).aptr.rtsp_transport);
    (data->state).aptr.rtsp_transport = (char *)0x0;
    (*Curl_cfree)((data->state).aptr.user);
    (data->state).aptr.user = (char *)0x0;
    (*Curl_cfree)((data->state).aptr.passwd);
    (data->state).aptr.passwd = (char *)0x0;
    (*Curl_cfree)((data->state).aptr.proxyuser);
    (data->state).aptr.proxyuser = (char *)0x0;
    (*Curl_cfree)((data->state).aptr.proxypasswd);
    (data->state).aptr.proxypasswd = (char *)0x0;
    Curl_mime_cleanpart((data->state).formp);
    (*Curl_cfree)((data->state).formp);
    (data->state).formp = (curl_mimepart *)0x0;
    Curl_wildcard_dtor(&data->wildcard);
    Curl_freeset(data);
    Curl_headers_cleanup(data);
    Curl_netrc_cleanup(&(data->state).netrc);
    (*Curl_cfree)(data);
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_close(struct Curl_easy **datap)
{
  struct Curl_easy *data;

  if(!datap || !*datap)
    return CURLE_OK;

  data = *datap;
  *datap = NULL;

  /* Detach connection if any is left. This should not be normal, but can be
     the case for example with CONNECT_ONLY + recv/send (test 556) */
  Curl_detach_connection(data);
  if(!data->state.internal) {
    if(data->multi)
      /* This handle is still part of a multi handle, take care of this first
         and detach this handle from there. */
      curl_multi_remove_handle(data->multi, data);

    if(data->multi_easy) {
      /* when curl_easy_perform() is used, it creates its own multi handle to
         use and this is the one */
      curl_multi_cleanup(data->multi_easy);
      data->multi_easy = NULL;
    }
  }

  Curl_expire_clear(data); /* shut off any timers left */

  data->magic = 0; /* force a clear AFTER the possibly enforced removal from
                      the multi handle, since that function uses the magic
                      field! */

  if(data->state.rangestringalloc)
    free(data->state.range);

  /* freed here just in case DONE was not called */
  Curl_req_free(&data->req, data);

  /* Close down all open SSL info and sessions */
  Curl_ssl_close_all(data);
  Curl_safefree(data->state.first_host);
  Curl_ssl_free_certinfo(data);

  if(data->state.referer_alloc) {
    Curl_safefree(data->state.referer);
    data->state.referer_alloc = FALSE;
  }
  data->state.referer = NULL;

  up_free(data);
  Curl_dyn_free(&data->state.headerb);
  Curl_flush_cookies(data, TRUE);
#ifndef CURL_DISABLE_ALTSVC
  Curl_altsvc_save(data, data->asi, data->set.str[STRING_ALTSVC]);
  Curl_altsvc_cleanup(&data->asi);
#endif
#ifndef CURL_DISABLE_HSTS
  Curl_hsts_save(data, data->hsts, data->set.str[STRING_HSTS]);
  if(!data->share || !data->share->hsts)
    Curl_hsts_cleanup(&data->hsts);
  curl_slist_free_all(data->state.hstslist); /* clean up list */
#endif
#if !defined(CURL_DISABLE_HTTP) && !defined(CURL_DISABLE_DIGEST_AUTH)
  Curl_http_auth_cleanup_digest(data);
#endif
  Curl_safefree(data->info.contenttype);
  Curl_safefree(data->info.wouldredirect);

  /* this destroys the channel and we cannot use it anymore after this */
  Curl_resolver_cancel(data);
  Curl_resolver_cleanup(data->state.async.resolver);

  data_priority_cleanup(data);

  /* No longer a dirty share, if it exists */
  if(data->share) {
    Curl_share_lock(data, CURL_LOCK_DATA_SHARE, CURL_LOCK_ACCESS_SINGLE);
    data->share->dirty--;
    Curl_share_unlock(data, CURL_LOCK_DATA_SHARE);
  }

#ifndef CURL_DISABLE_PROXY
  Curl_safefree(data->state.aptr.proxyuserpwd);
#endif
  Curl_safefree(data->state.aptr.uagent);
  Curl_safefree(data->state.aptr.userpwd);
  Curl_safefree(data->state.aptr.accept_encoding);
  Curl_safefree(data->state.aptr.te);
  Curl_safefree(data->state.aptr.rangeline);
  Curl_safefree(data->state.aptr.ref);
  Curl_safefree(data->state.aptr.host);
#ifndef CURL_DISABLE_COOKIES
  Curl_safefree(data->state.aptr.cookiehost);
#endif
#ifndef CURL_DISABLE_RTSP
  Curl_safefree(data->state.aptr.rtsp_transport);
#endif
  Curl_safefree(data->state.aptr.user);
  Curl_safefree(data->state.aptr.passwd);
#ifndef CURL_DISABLE_PROXY
  Curl_safefree(data->state.aptr.proxyuser);
  Curl_safefree(data->state.aptr.proxypasswd);
#endif

#if !defined(CURL_DISABLE_HTTP) && !defined(CURL_DISABLE_FORM_API)
  Curl_mime_cleanpart(data->state.formp);
  Curl_safefree(data->state.formp);
#endif

  /* destruct wildcard structures if it is needed */
  Curl_wildcard_dtor(&data->wildcard);
  Curl_freeset(data);
  Curl_headers_cleanup(data);
  Curl_netrc_cleanup(&data->state.netrc);
  free(data);
  return CURLE_OK;
}